

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O2

int Fl::screen_num(int x,int y)

{
  int i;
  int n;
  int sh;
  int sw;
  int sy;
  int sx;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  if (num_screens < 0) {
    screen_init();
  }
  n = 0;
  while( true ) {
    if (num_screens <= n) {
      return 0;
    }
    local_34 = 0;
    local_38 = 0;
    local_3c = 0;
    local_40 = 0;
    screen_xywh(&local_34,&local_38,&local_3c,&local_40,n);
    if ((((local_34 <= x) && (x < local_34 + local_3c)) && (local_38 <= y)) &&
       (y < local_38 + local_40)) break;
    n = n + 1;
  }
  return n;
}

Assistant:

int Fl::screen_num(int x, int y) {
  int screen = 0;
  if (num_screens < 0) screen_init();
  
  for (int i = 0; i < num_screens; i ++) {
    int sx = 0, sy = 0, sw = 0, sh = 0;
    Fl::screen_xywh(sx, sy, sw, sh, i);
    if ((x >= sx) && (x < (sx+sw)) && (y >= sy) && (y < (sy+sh))) {
      screen = i;
      break;
    }
  }
  return screen;
}